

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_set_user(exr_context_t ctxt,int part_index,char *name,char *type,int32_t size,void *out)

{
  undefined8 uVar1;
  exr_const_context_t in_RCX;
  uint8_t **in_RDX;
  int in_ESI;
  char *in_RDI;
  undefined4 in_R8D;
  char *in_R9;
  exr_attribute_list_t *unaff_retaddr;
  exr_context_t in_stack_00000008;
  exr_priv_part_t part;
  exr_result_t rv;
  exr_attribute_t *attr;
  exr_attr_opaquedata_t *opq;
  undefined1 *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int32_t in_stack_ffffffffffffffa4;
  exr_context_t ctxt_00;
  uint in_stack_ffffffffffffffb0;
  exr_context_t ctxt_01;
  exr_attribute_t **in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar2;
  
  ctxt_01 = (exr_context_t)0x0;
  if (in_RDI == (char *)0x0) {
    eVar2 = 2;
  }
  else {
    internal_exr_lock((exr_const_context_t)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      internal_exr_unlock((exr_const_context_t)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      eVar2 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      ctxt_00 = *(exr_context_t *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (*in_RDI == '\0') {
        internal_exr_unlock((exr_const_context_t)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        eVar2 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
      }
      else if (*in_RDI == '\x03') {
        internal_exr_unlock((exr_const_context_t)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        eVar2 = (**(code **)(in_RDI + 0x38))(in_RDI,0x15);
      }
      else {
        eVar2 = exr_attr_list_find_by_name
                          (in_RCX,(exr_attribute_list_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0)
                           ,in_R9,in_stack_ffffffffffffffc0);
        if (eVar2 == 0xf) {
          if (*in_RDI != '\x01') {
            internal_exr_unlock((exr_const_context_t)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
            return eVar2;
          }
          in_stack_ffffffffffffff98 = &stack0xffffffffffffffb8;
          eVar2 = exr_attr_list_add_by_type
                            (in_stack_00000008,unaff_retaddr,
                             (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             in_RDI,in_ESI,in_RDX,(exr_attribute_t **)attr);
        }
        else {
          if (eVar2 != 0) {
            internal_exr_unlock((exr_const_context_t)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
            return eVar2;
          }
          if (*(int *)((long)&(ctxt_01->filename).str + 4) != 0x1e) {
            internal_exr_unlock((exr_const_context_t)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
            uVar1._0_4_ = (ctxt_01->filename).length;
            uVar1._4_4_ = (ctxt_01->filename).alloc_size;
            eVar2 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,0x10,
                               "\'%s\' requested type \'%s\', but stored attributes is type \'%s\'",
                               in_RDX,in_RCX,uVar1);
            return eVar2;
          }
          eVar2 = 0;
        }
        if (*(long *)(*(long *)&ctxt_01->tmp_filename + 0x28) == 0) {
          eVar2 = exr_attr_opaquedata_set_packed
                            (ctxt_01,(exr_attr_opaquedata_t *)
                                     CONCAT44(eVar2,in_stack_ffffffffffffffb0),ctxt_00,
                             in_stack_ffffffffffffffa4);
        }
        else {
          eVar2 = exr_attr_opaquedata_set_unpacked
                            (ctxt_00,(exr_attr_opaquedata_t *)
                                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             in_stack_ffffffffffffff98,0);
          if (eVar2 == 0) {
            eVar2 = exr_attr_opaquedata_pack
                              (ctxt_01,(exr_attr_opaquedata_t *)(ulong)in_stack_ffffffffffffffb0,
                               (int32_t *)ctxt_00,
                               (void **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                ));
          }
        }
        internal_exr_unlock((exr_const_context_t)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      }
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_set_user (
    exr_context_t ctxt,
    int           part_index,
    const char*   name,
    const char*   type,
    int32_t       size,
    const void*   out)
{
    exr_attr_opaquedata_t* opq;
    exr_attribute_t*       attr = NULL;
    exr_result_t           rv   = EXR_ERR_SUCCESS;
    EXR_LOCK_AND_DEFINE_PART (part_index);
    if (ctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (ctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_ALREADY_WROTE_ATTRS));
    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);
    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        if (ctxt->mode != EXR_CONTEXT_WRITE) return EXR_UNLOCK_AND_RETURN (rv);
        rv = exr_attr_list_add_by_type (
            ctxt, &(part->attributes), name, type, 0, NULL, &(attr));
    }
    else if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->type != EXR_ATTR_OPAQUE)
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'%s' requested type '%s', but stored attributes is type '%s'",
                name,
                type,
                attr->type_name));
    }
    else
        return EXR_UNLOCK_AND_RETURN (rv);

    opq = attr->opaque;
    if (opq->pack_func_ptr)
    {
        rv = exr_attr_opaquedata_set_unpacked (
            ctxt, attr->opaque, EXR_CONST_CAST (void*, out), size);
        if (rv == EXR_ERR_SUCCESS)
            rv = exr_attr_opaquedata_pack (ctxt, attr->opaque, NULL, NULL);
    }
    else
        rv = exr_attr_opaquedata_set_packed (ctxt, attr->opaque, out, size);
    return EXR_UNLOCK_AND_RETURN (rv);
}